

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

int tnt_sbuf_object_grow_stack(tnt_sbuf_object *sbo)

{
  byte bVar1;
  tnt_sbo_stack *ptVar2;
  tnt_sbo_stack *stack;
  uint8_t new_stack_alloc;
  tnt_sbuf_object *sbo_local;
  
  if (sbo->stack_alloc == 0x80) {
    sbo_local._4_4_ = -1;
  }
  else {
    bVar1 = sbo->stack_alloc << 1;
    ptVar2 = (tnt_sbo_stack *)tnt_mem_alloc((ulong)bVar1 << 4);
    if (ptVar2 == (tnt_sbo_stack *)0x0) {
      sbo_local._4_4_ = -1;
    }
    else {
      tnt_mem_free(sbo->stack);
      sbo->stack_alloc = bVar1;
      sbo->stack = ptVar2;
      sbo_local._4_4_ = 0;
    }
  }
  return sbo_local._4_4_;
}

Assistant:

static int
tnt_sbuf_object_grow_stack(struct tnt_sbuf_object *sbo)
{
	if (sbo->stack_alloc == 128) return -1;
	uint8_t new_stack_alloc = 2 * sbo->stack_alloc;
	struct tnt_sbo_stack *stack = tnt_mem_alloc(new_stack_alloc * sizeof(
				struct tnt_sbo_stack));
	if (!stack) return -1;
	tnt_mem_free(sbo->stack);
	sbo->stack_alloc = new_stack_alloc;
	sbo->stack = stack;
	return 0;
}